

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void InsertNodeAsParent(Node *element,Node *node)

{
  Node *pNVar1;
  
  node->content = element;
  node->last = element;
  node->parent = element->parent;
  element->parent = node;
  pNVar1 = node->parent;
  if (pNVar1->content == element) {
    pNVar1->content = node;
  }
  if (pNVar1->last == element) {
    pNVar1->last = node;
  }
  node->prev = element->prev;
  element->prev = (Node *)0x0;
  if (node->prev != (Node *)0x0) {
    node->prev->next = node;
  }
  node->next = element->next;
  element->next = (Node *)0x0;
  if (node->next != (Node *)0x0) {
    node->next->prev = node;
  }
  return;
}

Assistant:

static void InsertNodeAsParent(Node *element, Node *node)
{
    node->content = element;
    node->last = element;
    node->parent = element->parent;
    element->parent = node;

    if (node->parent->content == element)
        node->parent->content = node;

    if (node->parent->last == element)
        node->parent->last = node;

    node->prev = element->prev;
    element->prev = NULL;

    if (node->prev)
        node->prev->next = node;

    node->next = element->next;
    element->next = NULL;

    if (node->next)
        node->next->prev = node;
}